

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libntlmconnect.c
# Opt level: O2

int test(char *url)

{
  uint __i;
  int iVar1;
  int iVar2;
  size_t sVar3;
  void *__ptr;
  CURL **ppCVar4;
  undefined8 uVar5;
  CURL *pCVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  char cVar13;
  int *piVar14;
  bool bVar15;
  timeval tVar16;
  int local_1d4;
  int running;
  int maxfd;
  long timeout;
  timeval interval;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  
  sVar3 = strlen(url);
  sVar3 = sVar3 + 5;
  __ptr = malloc(sVar3);
  tv_test_start = tutil_tvnow();
  if (__ptr == (void *)0x0) {
    curl_mfprintf(_stderr,"Not enough memory for full url\n");
    iVar1 = 0x7e;
  }
  else {
    ppCVar4 = easy;
    for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 4) {
      *ppCVar4 = (CURL *)0x0;
      *(undefined4 *)((long)sockets + lVar10) = 0xffffffff;
      ppCVar4 = ppCVar4 + 1;
    }
    iVar1 = curl_global_init(3);
    uVar12 = _stderr;
    if (iVar1 == 0) {
      if (res == 0) {
        lVar10 = curl_multi_init();
        if (lVar10 == 0) {
          curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/libntlmconnect.c"
                        ,0x74);
          res = 0x7b;
        }
        else if (res == 0) {
          cVar13 = '\0';
          local_1d4 = 0;
LAB_001023fb:
          do {
            timeout = -99;
            maxfd = -99;
            if (cVar13 == '\0') {
              pCVar6 = (CURL *)curl_easy_init();
              easy[local_1d4] = pCVar6;
              if (pCVar6 == (CURL *)0x0) {
                curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/libntlmconnect.c"
                              ,0x87);
                res = 0x7c;
              }
              else if (res == 0) {
                ppCVar4 = easy + local_1d4;
                if (local_1d4 % 3 == 2) {
                  curl_msnprintf(__ptr,sVar3,"%s0200",url);
                  iVar1 = curl_easy_setopt(*ppCVar4,0x6b,8);
                  uVar12 = _stderr;
                  if (iVar1 == 0) {
LAB_001024bd:
                    if (res != 0) break;
                    iVar1 = curl_easy_setopt(*ppCVar4,0x4a,1);
                    uVar12 = _stderr;
                    if (iVar1 == 0) {
                      if (res != 0) break;
                      iVar1 = curl_easy_setopt(*ppCVar4,0x2712,__ptr);
                      uVar12 = _stderr;
                      if (iVar1 == 0) {
                        if (res != 0) break;
                        iVar1 = curl_easy_setopt(*ppCVar4,0x29,1);
                        uVar12 = _stderr;
                        if (iVar1 == 0) {
                          if (res != 0) break;
                          iVar1 = curl_easy_setopt(*ppCVar4,0x50,1);
                          uVar12 = _stderr;
                          if (iVar1 == 0) {
                            if (res != 0) break;
                            iVar1 = curl_easy_setopt(*ppCVar4,0x2715,"testuser:testpass");
                            uVar12 = _stderr;
                            if (iVar1 == 0) {
                              if (res != 0) break;
                              iVar1 = curl_easy_setopt(*ppCVar4,0x4e2b,callback);
                              uVar12 = _stderr;
                              if (iVar1 == 0) {
                                if (res != 0) break;
                                iVar1 = curl_easy_setopt(*ppCVar4,0x2711);
                                uVar12 = _stderr;
                                if (iVar1 == 0) {
                                  if (res != 0) break;
                                  iVar1 = curl_easy_setopt(*ppCVar4,0x2a,1);
                                  uVar12 = _stderr;
                                  if (iVar1 == 0) {
                                    if (res != 0) break;
                                    iVar1 = curl_multi_add_handle(lVar10,*ppCVar4);
                                    uVar12 = _stderr;
                                    if (iVar1 == 0) {
                                      if (res == 0) {
                                        local_1d4 = local_1d4 + 1;
                                        cVar13 = '\x01';
                                        goto LAB_00102657;
                                      }
                                      break;
                                    }
                                    uVar5 = curl_multi_strerror(iVar1);
                                    pcVar9 = 
                                    "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
                                    uVar11 = 0x9a;
                                  }
                                  else {
                                    uVar5 = curl_easy_strerror(iVar1);
                                    pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                                    uVar11 = 0x98;
                                  }
                                }
                                else {
                                  uVar5 = curl_easy_strerror(iVar1);
                                  pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                                  uVar11 = 0x97;
                                }
                              }
                              else {
                                uVar5 = curl_easy_strerror(iVar1);
                                pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                                uVar11 = 0x96;
                              }
                            }
                            else {
                              uVar5 = curl_easy_strerror(iVar1);
                              pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                              uVar11 = 0x95;
                            }
                          }
                          else {
                            uVar5 = curl_easy_strerror(iVar1);
                            pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                            uVar11 = 0x94;
                          }
                        }
                        else {
                          uVar5 = curl_easy_strerror(iVar1);
                          pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                          uVar11 = 0x93;
                        }
                      }
                      else {
                        uVar5 = curl_easy_strerror(iVar1);
                        pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                        uVar11 = 0x92;
                      }
                    }
                    else {
                      uVar5 = curl_easy_strerror(iVar1);
                      pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                      uVar11 = 0x91;
                    }
                  }
                  else {
                    uVar5 = curl_easy_strerror(iVar1);
                    pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                    uVar11 = 0x8b;
                  }
                }
                else {
                  curl_msnprintf(__ptr,sVar3,"%s0100",url);
                  iVar1 = curl_easy_setopt(*ppCVar4,0x6b,1);
                  uVar12 = _stderr;
                  if (iVar1 == 0) goto LAB_001024bd;
                  uVar5 = curl_easy_strerror(iVar1);
                  pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                  uVar11 = 0x8f;
                }
LAB_00102ce9:
                curl_mfprintf(uVar12,pcVar9,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/libntlmconnect.c"
                              ,uVar11,iVar1,uVar5);
                res = iVar1;
              }
              break;
            }
LAB_00102657:
            iVar1 = curl_multi_perform(lVar10,&running);
            uVar12 = _stderr;
            if (iVar1 != 0) {
              uVar5 = curl_multi_strerror(iVar1);
              pcVar9 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
              uVar11 = 0x9f;
              goto LAB_00102ce9;
            }
            if (running < 0) {
              pcVar9 = 
              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
              ;
              uVar12 = 0x9f;
LAB_00102a00:
              curl_mfprintf(_stderr,pcVar9,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/libntlmconnect.c"
                            ,uVar12);
              res = 0x7a;
              break;
            }
            if (res != 0) break;
            curl_mfprintf(_stderr,"%s:%d running %d state %d\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/libntlmconnect.c"
                          ,0xa2,running,cVar13);
            tVar16 = tutil_tvnow();
            lVar7 = tutil_tvdiff(tVar16,tv_test_start);
            if (5000 < lVar7) {
              uVar12 = 0xa4;
LAB_00102aee:
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/libntlmconnect.c"
                            ,uVar12);
              res = 0x7d;
              break;
            }
            if ((res != 0) || ((cVar13 == '\x02' && (running == 0)))) break;
            for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
              fdread.__fds_bits[lVar7] = 0;
            }
            for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
              fdwrite.__fds_bits[lVar7] = 0;
            }
            for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
              fdexcep.__fds_bits[lVar7] = 0;
            }
            iVar1 = curl_multi_fdset(lVar10,&fdread,&fdwrite,&fdexcep,&maxfd);
            uVar12 = _stderr;
            if (iVar1 != 0) {
              uVar5 = curl_multi_strerror(iVar1);
              pcVar9 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
              uVar11 = 0xad;
              goto LAB_00102ce9;
            }
            if (maxfd < -1) {
              pcVar9 = 
              "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
              uVar12 = 0xad;
              goto LAB_00102a00;
            }
            if (res != 0) break;
            bVar15 = cVar13 == '\x01';
            cVar13 = '\x02';
            if (bVar15) {
              if (maxfd != -1) {
                curl_mfprintf(_stderr,
                              "Warning: socket did not open immediately for new handle (trying again)\n"
                             );
                cVar13 = '\x01';
                goto LAB_001023fb;
              }
              cVar13 = (2 < local_1d4) * '\x02';
              curl_mfprintf(_stderr,"%s:%d new state %d\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/libntlmconnect.c"
                            ,0xba,cVar13);
            }
            iVar1 = curl_multi_timeout(lVar10,&timeout);
            uVar12 = _stderr;
            if (iVar1 != 0) {
              uVar5 = curl_multi_strerror(iVar1);
              pcVar9 = "%s:%d curl_multi_timeout() failed, with code %d (%s)\n";
              uVar11 = 0xbd;
              goto LAB_00102ce9;
            }
            if (timeout < -1) {
              curl_mfprintf(_stderr,
                            "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/libntlmconnect.c"
                            ,0xbd,timeout);
              res = 0x73;
              break;
            }
            if (res != 0) break;
            iVar1 = running;
            curl_mfprintf(_stderr,"%s:%d num_handles %d timeout %ld running %d\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/libntlmconnect.c"
                          ,0xc2,local_1d4,timeout,running);
            if (timeout == -1) {
              interval.tv_sec = 0;
              interval.tv_usec = 5000;
              if (local_1d4 == 3 && running == 0) break;
            }
            else {
              uVar8 = timeout;
              if (0x7ffffffe < timeout) {
                uVar8 = 0x7fffffff;
              }
              uVar8 = (ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff;
              interval.tv_sec = (__time_t)(int)((long)uVar8 / 1000);
              interval.tv_usec = (__suseconds_t)((int)((long)uVar8 % 1000) * 1000);
            }
            iVar2 = select_wrapper(maxfd + 1,&fdread,&fdwrite,&fdexcep,&interval);
            if (iVar2 == -1) {
              piVar14 = __errno_location();
              uVar12 = _stderr;
              iVar2 = *piVar14;
              pcVar9 = strerror(iVar2);
              curl_mfprintf(uVar12,"%s:%d select() failed, with errno %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/libntlmconnect.c"
                            ,0xd5,iVar2,pcVar9,iVar1);
              res = 0x79;
              break;
            }
            if (res != 0) break;
            tVar16 = tutil_tvnow();
            lVar7 = tutil_tvdiff(tVar16,tv_test_start);
            if (5000 < lVar7) {
              uVar12 = 0xd7;
              goto LAB_00102aee;
            }
          } while (res == 0);
        }
        ppCVar4 = easy;
        piVar14 = counter;
        for (uVar8 = 0; uVar8 != 3; uVar8 = uVar8 + 1) {
          curl_mprintf("Data connection %d: %d\n",uVar8 & 0xffffffff,*piVar14);
          curl_multi_remove_handle(lVar10,*ppCVar4);
          curl_easy_cleanup(*ppCVar4);
          ppCVar4 = ppCVar4 + 1;
          piVar14 = piVar14 + 1;
        }
        curl_multi_cleanup(lVar10);
        curl_global_cleanup();
        free(__ptr);
        iVar1 = res;
        goto LAB_001023bf;
      }
    }
    else {
      uVar5 = curl_easy_strerror(iVar1);
      curl_mfprintf(uVar12,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/libntlmconnect.c"
                    ,0x6e,iVar1,uVar5);
      res = iVar1;
    }
    iVar1 = res;
    free(__ptr);
  }
LAB_001023bf:
  return iVar1;
}

Assistant:

int test(char *url)
{
  CURLM *multi = NULL;
  int running;
  int i;
  int num_handles = 0;
  enum HandleState state = ReadyForNewHandle;
  size_t urllen = strlen(url) + 4 + 1;
  char *full_url = malloc(urllen);

  start_test_timing();

  if(!full_url) {
    fprintf(stderr, "Not enough memory for full url\n");
    return TEST_ERR_MAJOR_BAD;
  }

  for(i = 0; i < MAX_EASY_HANDLES; ++i) {
    easy[i] = NULL;
    sockets[i] = CURL_SOCKET_BAD;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    free(full_url);
    return res;
  }

  multi_init(multi);

#ifdef USE_PIPELINING
  multi_setopt(multi, CURLMOPT_PIPELINING, 1L);
  multi_setopt(multi, CURLMOPT_MAX_HOST_CONNECTIONS, 5L);
  multi_setopt(multi, CURLMOPT_MAX_TOTAL_CONNECTIONS, 10L);
#endif

  for(;;) {
    struct timeval interval;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    long timeout = -99;
    int maxfd = -99;
    bool found_new_socket = FALSE;

    /* Start a new handle if we aren't at the max */
    if(state == ReadyForNewHandle) {
      easy_init(easy[num_handles]);

      if(num_handles % 3 == 2) {
        msnprintf(full_url, urllen, "%s0200", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_NTLM);
      }
      else {
        msnprintf(full_url, urllen, "%s0100", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
      }
      easy_setopt(easy[num_handles], CURLOPT_FRESH_CONNECT, 1L);
      easy_setopt(easy[num_handles], CURLOPT_URL, full_url);
      easy_setopt(easy[num_handles], CURLOPT_VERBOSE, 1L);
      easy_setopt(easy[num_handles], CURLOPT_HTTPGET, 1L);
      easy_setopt(easy[num_handles], CURLOPT_USERPWD, "testuser:testpass");
      easy_setopt(easy[num_handles], CURLOPT_WRITEFUNCTION, callback);
      easy_setopt(easy[num_handles], CURLOPT_WRITEDATA, easy + num_handles);
      easy_setopt(easy[num_handles], CURLOPT_HEADER, 1L);

      multi_add_handle(multi, easy[num_handles]);
      num_handles += 1;
      state = NeedSocketForNewHandle;
    }

    multi_perform(multi, &running);

    fprintf(stderr, "%s:%d running %d state %d\n",
            __FILE__, __LINE__, running, state);

    abort_on_test_timeout();

    if(!running && state == NoMoreHandles)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    if(state == NeedSocketForNewHandle) {
      if(maxfd != -1 && !found_new_socket) {
        fprintf(stderr, "Warning: socket did not open immediately for new "
                "handle (trying again)\n");
        continue;
      }
      state = num_handles < MAX_EASY_HANDLES ? ReadyForNewHandle
                                             : NoMoreHandles;
      fprintf(stderr, "%s:%d new state %d\n",
              __FILE__, __LINE__, state);
    }

    multi_timeout(multi, &timeout);

    /* At this point, timeout is guaranteed to be greater or equal than -1. */

    fprintf(stderr, "%s:%d num_handles %d timeout %ld running %d\n",
            __FILE__, __LINE__, num_handles, timeout, running);

    if(timeout != -1L) {
      int itimeout = (timeout > (long)INT_MAX) ? INT_MAX : (int)timeout;
      interval.tv_sec = itimeout/1000;
      interval.tv_usec = (itimeout%1000)*1000;
    }
    else {
      interval.tv_sec = 0;
      interval.tv_usec = 5000;

      /* if there's no timeout and we get here on the last handle, we may
         already have read the last part of the stream so waiting makes no
         sense */
      if(!running && num_handles == MAX_EASY_HANDLES) {
        break;
      }
    }

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i = 0; i < MAX_EASY_HANDLES; i++) {
    printf("Data connection %d: %d\n", i, counter[i]);
    curl_multi_remove_handle(multi, easy[i]);
    curl_easy_cleanup(easy[i]);
  }

  curl_multi_cleanup(multi);
  curl_global_cleanup();

  free(full_url);

  return res;
}